

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

String * __thiscall String::mid(String *__return_storage_ptr__,String *this,size_t from,size_t l)

{
  size_t sVar1;
  size_t sVar2;
  string local_48;
  size_t local_28;
  size_t l_local;
  size_t from_local;
  String *this_local;
  
  local_28 = l;
  l_local = from;
  from_local = (size_t)this;
  this_local = __return_storage_ptr__;
  if (l == 0xffffffffffffffff) {
    local_28 = size(this);
    local_28 = local_28 - l_local;
  }
  sVar1 = local_28;
  if ((l_local == 0) && (sVar2 = size(this), sVar1 == sVar2)) {
    String(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
  String(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

String mid(size_t from, size_t l = npos) const
    {
        if (l == npos)
            l = size() - from;
        if (from == 0 && l == size())
            return *this;
        return mString.substr(from, l);
    }